

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

void __thiscall xray_re::xr_object::save_skls(xr_object *this,xr_writer *w)

{
  f_w_const<xray_re::xr_skl_motion> write;
  xr_writer *this_00;
  size_type value;
  mem_func in_stack_ffffffffffffffa8;
  f_w_const<xray_re::xr_skl_motion> local_28;
  xr_writer *local_18;
  xr_writer *w_local;
  xr_object *this_local;
  
  local_18 = w;
  w_local = (xr_writer *)this;
  value = std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::size
                    (&this->m_motions);
  xr_writer::w_size_u32(w,value);
  this_00 = local_18;
  xr_writer::f_w_const<xray_re::xr_skl_motion>::f_w_const(&local_28,0x19);
  write._8_8_ = w;
  write.m_f = in_stack_ffffffffffffffa8;
  xr_writer::
  w_seq<std::vector<xray_re::xr_skl_motion*,std::allocator<xray_re::xr_skl_motion*>>,xray_re::xr_writer::f_w_const<xray_re::xr_skl_motion>>
            (this_00,&this->m_motions,write);
  return;
}

Assistant:

void xr_object::save_skls(xr_writer& w) const
{
	w.w_size_u32(m_motions.size());
	w.w_seq(m_motions, xr_writer::f_w_const<xr_skl_motion>(&xr_skl_motion::save));
}